

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O1

void calc_buffer_dimensions_ppm(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  uint uVar1;
  
  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    uVar1 = cinfo->output_width * cinfo->out_color_components;
  }
  else {
    uVar1 = cinfo->output_width * 3;
  }
  *(uint *)&dinfo[1].calc_buffer_dimensions = uVar1;
  dinfo[1].finish_output = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)(ulong)uVar1;
  return;
}

Assistant:

METHODDEF(void)
calc_buffer_dimensions_ppm(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;

  if (cinfo->out_color_space == JCS_GRAYSCALE)
    dest->samples_per_row = cinfo->output_width * cinfo->out_color_components;
  else
    dest->samples_per_row = cinfo->output_width * 3;
  dest->buffer_width = dest->samples_per_row * (BYTESPERSAMPLE * sizeof(char));
}